

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chained_buffer.cpp
# Opt level: O0

void __thiscall libtorrent::aux::chained_buffer::~chained_buffer(chained_buffer *this)

{
  chained_buffer *this_local;
  
  clear(this);
  ::std::vector<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>::~vector
            (&this->m_tmp_vec);
  ::std::
  deque<libtorrent::aux::chained_buffer::buffer_t,_std::allocator<libtorrent::aux::chained_buffer::buffer_t>_>
  ::~deque(&this->m_vec);
  return;
}

Assistant:

chained_buffer::~chained_buffer()
	{
		TORRENT_ASSERT(!m_destructed);
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(m_bytes >= 0);
		TORRENT_ASSERT(m_capacity >= 0);
		clear();
#if TORRENT_USE_ASSERTS
		m_destructed = true;
#endif
	}